

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Create.hpp
# Opt level: O2

Gen<char> * rc::gen::just<char>(Gen<char> *__return_storage_ptr__,char *value)

{
  Shrinkable<char> local_20;
  Shrinkable<char> local_18;
  
  rc::shrinkable::just<char>((shrinkable *)&local_20,value);
  local_18.m_impl = local_20.m_impl;
  local_20.m_impl = (IShrinkableImpl *)0x0;
  Gen<char>::Gen<rc::fn::Constant<rc::Shrinkable<char>>,void>
            (__return_storage_ptr__,(Constant<rc::Shrinkable<char>_> *)&local_18);
  Shrinkable<char>::~Shrinkable(&local_18);
  Shrinkable<char>::~Shrinkable(&local_20);
  return __return_storage_ptr__;
}

Assistant:

Gen<Decay<T>> just(T &&value) {
  return fn::constant(shrinkable::just(std::forward<T>(value)));
}